

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsPrimaryTypes.cpp
# Opt level: O2

void helics::valueExtract(defV *data,NamedPoint *val)

{
  string_view val_00;
  variant_alternative_t<0UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *pvVar1;
  variant_alternative_t<6UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *pvVar2;
  variant_alternative_t<1UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *pvVar3;
  helics *phVar4;
  uint *puVar5;
  undefined8 extraout_RDX;
  vector<double,_std::allocator<double>_> *val_01;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *val_02;
  size_t unaff_RBX;
  NamedPoint *pNVar6;
  char *unaff_R14;
  double dVar7;
  variant_alternative_t<0UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  vVar8;
  complex<double> val_03;
  complex<double> val_04;
  NamedPoint local_40;
  
  puVar5 = &switchD_001c4040::switchdataD_00338028;
  switch((data->
         super__Variant_base<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
         ).
         super__Move_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
         .
         super__Copy_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
         .
         super__Move_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
         .
         super__Copy_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
         .
         super__Variant_storage_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
         ._M_index) {
  case '\0':
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
              (&val->name,"value");
    pvVar1 = std::
             get<0ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       (data);
    break;
  case '\x01':
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
              (&val->name,"value");
    pvVar3 = std::
             get<1ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       (data);
    vVar8 = (variant_alternative_t<0UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
             )*pvVar3;
    goto LAB_001c4198;
  default:
    std::
    get<2ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
              (data);
    val_00._M_str = unaff_R14;
    val_00._M_len = unaff_RBX;
    helicsGetNamedPoint(val_00);
    NamedPoint::operator=(val,&local_40);
    goto LAB_001c41ba;
  case '\x03':
    pNVar6 = val;
    std::
    get<3ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
              (data);
    val_03._M_value._8_8_ = puVar5;
    val_03._M_value._0_8_ = extraout_RDX;
    helicsComplexString_abi_cxx11_(&local_40.name,(helics *)pNVar6,val_03);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&val->name,&local_40.name);
LAB_001c4187:
    std::__cxx11::string::~string((string *)&local_40);
    vVar8 = nan("0");
    goto LAB_001c4198;
  case '\x04':
    phVar4 = (helics *)
             std::
             get<4ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       (data);
    if (*(long *)(phVar4 + 8) - *(long *)phVar4 != 8) {
      helicsVectorString_abi_cxx11_(&local_40.name,phVar4,val_01);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=(&val->name,&local_40.name);
      goto LAB_001c4187;
    }
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
              (&val->name,"value");
    pvVar1 = *(variant_alternative_t<0UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
               **)phVar4;
    break;
  case '\x05':
    pNVar6 = val;
    dVar7 = nan("0");
    val->value = dVar7;
    phVar4 = (helics *)
             std::
             get<5ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       (data);
    val_02 = (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             (*(long *)(phVar4 + 8) - *(long *)phVar4);
    if (val_02 == (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)0x10) {
      val_04._M_value._8_8_ = *(long *)phVar4;
      val_04._M_value._0_8_ = 0x10;
      helicsComplexString_abi_cxx11_(&local_40.name,(helics *)pNVar6,val_04);
    }
    else {
      helicsComplexVectorString_abi_cxx11_(&local_40.name,phVar4,val_02);
    }
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&val->name,&local_40.name);
LAB_001c41ba:
    std::__cxx11::string::~string((string *)&local_40);
    return;
  case '\x06':
    pvVar2 = std::
             get<6ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       (data);
    NamedPoint::operator=(val,pvVar2);
    return;
  }
  vVar8 = *pvVar1;
LAB_001c4198:
  val->value = vVar8;
  return;
}

Assistant:

void valueExtract(const defV& data, NamedPoint& val)
{
    switch (data.index()) {
        case double_loc:  // double
            val.name = "value";
            val.value = std::get<double>(data);
            break;
        case int_loc:  // int64_t
            val.name = "value";
            val.value = static_cast<double>(std::get<int64_t>(data));
            break;
        case string_loc:  // string
        default:
            val = helicsGetNamedPoint(std::get<std::string>(data));
            break;
        case complex_loc:  // complex
            val.name = helicsComplexString(std::get<std::complex<double>>(data));
            val.value = std::nan("0");
            break;
        case vector_loc:  // vector
        {
            const auto& vec = std::get<std::vector<double>>(data);
            if (vec.size() == 1) {
                val.name = "value";
                val.value = vec[0];
            } else {
                val.name = helicsVectorString(vec);
                val.value = std::nan("0");
            }

            break;
        }
        case complex_vector_loc: {
            val.value = std::nan("0");
            const auto& vec = std::get<std::vector<std::complex<double>>>(data);
            if (vec.size() == 1) {
                val.name = helicsComplexString(vec[0]);
            } else {
                val.name = helicsComplexVectorString(vec);
            }
            break;
        }
        case named_point_loc:
            val = std::get<NamedPoint>(data);
            break;
    }
}